

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

uint __thiscall
crnlib::dxt_image::get_subblock_index(dxt_image *this,uint x,uint y,uint element_index)

{
  bool bVar1;
  etc1_block *this_00;
  etc1_block *src_block;
  element *block;
  uint block_y;
  uint block_x;
  uint element_index_local;
  uint y_local;
  uint x_local;
  dxt_image *this_local;
  
  if (this->m_element_type[element_index] == cColorETC1) {
    this_00 = (etc1_block *)get_element(this,x >> 2,y >> 2,element_index);
    bVar1 = etc1_block::get_flip_bit(this_00);
    if (bVar1) {
      this_local._4_4_ = (uint)(1 < (y & 3));
    }
    else {
      this_local._4_4_ = (uint)(1 < (x & 3));
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint dxt_image::get_subblock_index(uint x, uint y, uint element_index) const
    {
        if (m_element_type[element_index] != cColorETC1)
        {
            return 0;
        }

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element& block = get_element(block_x, block_y, element_index);

        const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
        if (src_block.get_flip_bit())
        {
            return ((y & 3) >= 2) ? 1 : 0;
        }
        else
        {
            return ((x & 3) >= 2) ? 1 : 0;
        }
    }